

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

char * lua_getlocal(lua_State *L,lua_Debug *ar,int n)

{
  Value *pVVar1;
  int iVar2;
  TValue *io2;
  TValue *io1;
  StkId pos;
  TString *usertype;
  char *pcStack_28;
  ravi_type_map type;
  char *name;
  lua_Debug *plStack_18;
  int n_local;
  lua_Debug *ar_local;
  lua_State *L_local;
  
  iVar2 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar2 + 1;
  name._4_4_ = n;
  plStack_18 = ar;
  ar_local = (lua_Debug *)L;
  if (iVar2 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                  ,0xb8,"const char *lua_getlocal(lua_State *, const lua_Debug *, int)");
  }
  swapextra(L);
  if (plStack_18 == (lua_Debug *)0x0) {
    if (*(short *)(ar_local->namewhat + -8) == -0x7ffa) {
      if (*(short *)(ar_local->namewhat + -8) != -0x7ffa) {
        __assert_fail("((((L->top - 1))->tt_) == (((((6) | ((0) << 4))) | (1 << 15))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                      ,0xbe,"const char *lua_getlocal(lua_State *, const lua_Debug *, int)");
      }
      if (*(char *)(*(long *)(ar_local->namewhat + -0x10) + 8) != '\x06') {
        __assert_fail("(((L->top - 1)->value_).gc)->tt == ((6) | ((0) << 4))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                      ,0xbe,"const char *lua_getlocal(lua_State *, const lua_Debug *, int)");
      }
      pcStack_28 = luaF_getlocalname(*(Proto **)(*(long *)(ar_local->namewhat + -0x10) + 0x18),
                                     name._4_4_,0,(ravi_type_map *)((long)&usertype + 4),
                                     (TString **)&pos);
    }
    else {
      pcStack_28 = (char *)0x0;
    }
  }
  else {
    io1 = (TValue *)0x0;
    pcStack_28 = findlocal((lua_State *)ar_local,plStack_18->i_ci,name._4_4_,&io1,
                           (ravi_type_map *)((long)&usertype + 4),(TString **)&pos);
    if (pcStack_28 != (char *)0x0) {
      pVVar1 = (Value *)ar_local->namewhat;
      *pVVar1 = io1->value_;
      *(LuaType *)(pVVar1 + 1) = io1->tt_;
      if (((ulong)pVVar1[1] & 0x8000) != 0) {
        if (((ulong)pVVar1[1] & 0x8000) == 0) {
          __assert_fail("(((io1)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                        ,0xc4,"const char *lua_getlocal(lua_State *, const lua_Debug *, int)");
        }
        if ((*(ushort *)(pVVar1 + 1) & 0x7f) != (ushort)pVVar1->gc->tt) {
LAB_0011ac82:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                        ,0xc4,"const char *lua_getlocal(lua_State *, const lua_Debug *, int)");
        }
        if (ar_local != (lua_Debug *)0x0) {
          if (((ulong)pVVar1[1] & 0x8000) == 0) {
            __assert_fail("(((io1)->tt_) & (1 << 15))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                          ,0xc4,"const char *lua_getlocal(lua_State *, const lua_Debug *, int)");
          }
          if ((pVVar1->gc->marked & (ar_local->what[0x54] ^ 0x18U)) != 0) goto LAB_0011ac82;
        }
      }
      ar_local->namewhat = ar_local->namewhat + 0x10;
      if (*(char **)(ar_local->source + 8) < ar_local->namewhat) {
        __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                      ,0xc5,"const char *lua_getlocal(lua_State *, const lua_Debug *, int)");
      }
    }
  }
  swapextra((lua_State *)ar_local);
  iVar2 = *(int *)&(ar_local[-1].i_ci)->func + -1;
  *(int *)&(ar_local[-1].i_ci)->func = iVar2;
  if (iVar2 == 0) {
    return pcStack_28;
  }
  __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                ,0xc9,"const char *lua_getlocal(lua_State *, const lua_Debug *, int)");
}

Assistant:

LUA_API const char *lua_getlocal (lua_State *L, const lua_Debug *ar, int n) {
  const char *name;
  ravi_type_map type;
  TString *usertype;
  lua_lock(L);
  swapextra(L);
  if (ar == NULL) {  /* information about non-active function? */
    if (!isLfunction(L->top - 1))  /* not a Lua function? */
      name = NULL;
    else  /* consider live variables at function start (parameters) */
      name = luaF_getlocalname(clLvalue(L->top - 1)->p, n, 0, &type, &usertype);
  }
  else {  /* active function; get information through 'ar' */
    StkId pos = NULL;  /* to avoid warnings */
    name = findlocal(L, ar->i_ci, n, &pos, &type, &usertype);
    if (name) {
      setobj2s(L, L->top, pos);
      api_incr_top(L);
    }
  }
  swapextra(L);
  lua_unlock(L);
  return name;
}